

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  pointer pMVar15;
  int *piVar16;
  size_t sVar17;
  size_t sVar18;
  undefined1 auVar19 [12];
  Rect RVar20;
  undefined4 uVar21;
  int iVar22;
  int iVar23;
  void *pvVar24;
  undefined1 (*pauVar25) [16];
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  float *pfVar30;
  pointer pRVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  void *pvVar35;
  void *pvVar36;
  void *pvVar37;
  uint uVar38;
  undefined8 *puVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float in_XMM5_Db;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  vector<int,_std::allocator<int>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  Mat proposals;
  vector<float,_std::allocator<float>_> scores;
  Mat pbs;
  int local_254;
  Proposal *local_250;
  undefined1 local_248 [12];
  float fStack_23c;
  int *local_238;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_228;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  pointer local_1e8;
  long *plStack_1e0;
  undefined8 local_1d8;
  uint uStack_1d0;
  uint uStack_1cc;
  ulong local_1c8;
  vector<float,_std::allocator<float>_> local_1b8;
  pointer local_198;
  ulong local_190;
  ulong local_188;
  undefined8 *local_180;
  uint local_178;
  float local_174;
  float local_170;
  float local_16c;
  vector<float,_std::allocator<float>_> local_168;
  long *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_138;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  ulong local_128;
  void *local_120;
  void *local_118;
  undefined8 *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  void *local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_198 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f0 = (ulong)local_198->w;
  local_e8 = (ulong)(uint)local_198->h;
  uVar26 = (this->anchors).h;
  uVar38 = local_198->h * local_198->w;
  auVar47._4_4_ = -(uint)(uVar26 == 0);
  auVar47._0_4_ = -(uint)(uVar38 == 0);
  auVar47._8_8_ = 0;
  movmskps(3,auVar47 << 0x40);
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (pointer)0x4;
  plStack_1e0 = (long *)0x0;
  uStack_1d0 = uVar38;
  local_1d8 = 0x400000003;
  uStack_1cc = uVar26;
  local_1c8 = (long)(int)(uVar38 * 4) & 0x3ffffffffffffffc;
  lVar27 = local_1c8 * (long)(int)uVar26;
  local_250 = this;
  local_130 = top_blobs;
  if (lVar27 != 0) {
    pvVar24 = malloc(lVar27 * 4 + 0x1c);
    local_1f8._0_8_ = (long)pvVar24 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_1f8._0_8_ - 8) = pvVar24;
    local_1f8._8_8_ = local_1f8._0_8_ + lVar27 * 4;
    *(undefined4 *)local_1f8._8_8_ = 1;
  }
  local_190 = (ulong)uVar26;
  local_178 = uVar26;
  local_128 = (ulong)uVar38;
  if (0 < (int)uVar26) {
    uVar32 = local_f0 & 0xffffffff;
    lVar27 = local_198[1].cstep * local_198[1].elemsize;
    local_108 = local_198[1].data;
    lVar40 = (long)local_1d8._4_4_;
    local_110 = (undefined8 *)local_1f8._0_8_;
    local_f8 = (local_250->anchors).data;
    local_174 = (float)local_250->feat_stride;
    local_e0 = (long)(local_250->anchors).w;
    local_d0 = local_1c8 * (long)local_1e8;
    local_b8 = local_f0 * lVar40 * 4;
    local_118 = (void *)(lVar27 * 3 + (long)local_108);
    local_d8 = lVar27 * 4;
    local_c0 = local_f0 * 4;
    local_120 = (void *)((long)local_108 + lVar27 * 2);
    local_100 = (void *)(lVar27 + (long)local_108);
    local_188 = 0;
    do {
      if (0 < (int)local_e8) {
        local_c8 = local_188 * local_e0;
        uVar4 = *(undefined8 *)((long)local_f8 + local_c8 * 4);
        uVar5 = *(undefined8 *)((long)local_f8 + local_c8 * 4 + 8);
        fVar49 = (float)uVar5 - (float)uVar4;
        fVar53 = (float)((ulong)uVar4 >> 0x20);
        fVar50 = (float)((ulong)uVar5 >> 0x20) - fVar53;
        fStack_80 = fVar49 * 0.5;
        fStack_7c = fVar50 * 0.5;
        local_170 = (float)local_250->feat_stride;
        local_180 = local_110;
        uVar28 = 0;
        local_78 = CONCAT44(fVar50,fVar49);
        uStack_70 = 0;
        pvVar24 = local_100;
        pvVar35 = local_118;
        pvVar36 = local_108;
        pvVar37 = local_120;
        fVar55 = fVar53;
        fVar51 = fVar53;
        fVar48 = fVar53;
        local_98 = fVar50;
        fStack_94 = fVar50;
        fStack_90 = fVar50;
        fStack_8c = fVar50;
        fStack_84 = in_XMM5_Db;
        do {
          local_b0 = uVar28;
          if (0 < (int)local_f0) {
            fVar52 = *(float *)((long)local_f8 + local_c8 * 4);
            local_208._4_4_ = 0;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            uVar28 = 0;
            puVar39 = local_180;
            local_a8 = pvVar35;
            local_a0 = pvVar24;
            local_68 = fVar53;
            fStack_64 = fVar55;
            fStack_60 = fVar51;
            fStack_5c = fVar48;
            do {
              local_208._0_4_ = fVar52;
              local_16c = *(float *)((long)local_a8 + uVar28 * 4);
              local_48._0_4_ = (*(float *)((long)local_a0 + uVar28 * 4) + 0.5) * fVar50;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar36 + uVar28 * 4) + 0.5) * fVar49;
              local_48._12_4_ = 0;
              local_58 = expf(*(float *)((long)pvVar37 + uVar28 * 4));
              fVar49 = expf(local_16c);
              fVar53 = (float)local_48._8_4_ + (float)local_208._0_4_;
              fVar55 = (float)local_48._0_4_ + local_68;
              fVar50 = local_58 * fStack_80;
              fVar49 = fVar49 * fStack_7c;
              auVar42._4_4_ = fVar49;
              auVar42._0_4_ = fVar50;
              auVar42._8_4_ = fVar53;
              auVar42._12_4_ = fVar55;
              auVar19._4_8_ = auVar42._8_8_;
              auVar19._0_4_ = fVar49 + local_68 * fStack_84;
              auVar43._0_8_ = auVar19._0_8_ << 0x20;
              auVar43._8_4_ = fVar53 + fVar50;
              auVar43._12_4_ = fVar55 + fVar49;
              *puVar39 = CONCAT44(fVar55 - fVar49,fVar53 - fVar50);
              puVar39[1] = auVar43._8_8_;
              fVar52 = (float)local_208._0_4_ + local_170;
              uVar28 = uVar28 + 1;
              puVar39 = (undefined8 *)((long)puVar39 + lVar40 * 4);
              pvVar24 = local_a0;
              pvVar35 = local_a8;
              fVar49 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar50 = local_98;
              fVar53 = local_68;
              fVar55 = fStack_64;
              fVar51 = fStack_60;
              fVar48 = fStack_5c;
            } while (uVar32 != uVar28);
          }
          fVar53 = fVar53 + local_174;
          uVar28 = local_b0 + 1;
          local_180 = (undefined8 *)((long)local_180 + local_b8);
          pvVar35 = (void *)((long)pvVar35 + local_c0);
          pvVar37 = (void *)((long)pvVar37 + local_c0);
          pvVar24 = (void *)((long)pvVar24 + local_c0);
          pvVar36 = (void *)((long)pvVar36 + local_c0);
        } while (uVar28 != local_e8);
      }
      local_188 = local_188 + 1;
      local_110 = (undefined8 *)((long)local_110 + local_d0);
      local_118 = (void *)((long)local_118 + local_d8);
      local_120 = (void *)((long)local_120 + local_d8);
      local_100 = (void *)((long)local_100 + local_d8);
      local_108 = (void *)((long)local_108 + local_d8);
    } while (local_188 != local_190);
  }
  uVar32 = local_128 & 0xffffffff;
  if (0 < (int)local_178) {
    fVar49 = (float)*local_198[2].data;
    fVar50 = (float)((ulong)*local_198[2].data >> 0x20);
    auVar44._0_4_ = fVar50 + -1.0;
    auVar44._4_4_ = fVar49 + -1.0;
    auVar44._8_4_ = fVar50 + -1.0;
    auVar44._12_4_ = fVar49 + -1.0;
    uVar28 = 0;
    pauVar25 = (undefined1 (*) [16])local_1f8._0_8_;
    do {
      uVar33 = uVar32;
      pauVar34 = pauVar25;
      if (0 < (int)local_128) {
        do {
          auVar47 = minps(*pauVar34,auVar44);
          auVar47 = maxps(auVar47,ZEXT816(0));
          *pauVar34 = auVar47;
          pauVar34 = (undefined1 (*) [16])(*pauVar34 + (long)local_1d8._4_4_ * 4);
          uVar33 = uVar33 - 1;
        } while (uVar33 != 0);
      }
      uVar28 = uVar28 + 1;
      pauVar25 = (undefined1 (*) [16])(*pauVar25 + local_1c8 * (long)local_1e8);
    } while (uVar28 != local_190);
  }
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (int)local_178) {
    local_208._0_4_ = (float)local_250->min_size * *(float *)((long)local_198[2].data + 8);
    uVar33 = 0;
    uVar28 = local_190;
    do {
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_1c8 * uVar33 * (long)local_1e8 + local_1f8._0_8_);
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_1e8;
      local_150 = plStack_1e0;
      local_148._0_4_ = 2;
      uVar21 = (undefined4)local_148;
      local_148._0_4_ = 2;
      local_148._4_4_ = local_1d8._4_4_;
      uStack_140 = CONCAT44(1,uStack_1d0);
      local_138 = (long)(int)(uStack_1d0 * local_1d8._4_4_);
      if (0 < (int)local_128) {
        pfVar30 = (float *)(local_198->elemsize * local_198->cstep * uVar28 + (long)local_198->data)
        ;
        uVar29 = 0;
        do {
          lVar27 = (long)(int)uVar29 * (long)local_148._4_4_;
          if (((float)local_208._0_4_ <=
               (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27 + 2] + 1.0) -
               local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27]) &&
             ((float)local_208._0_4_ <=
              (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27 + 3] + 1.0) -
              local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar27 + 1])) {
            local_248._4_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27 + 1];
            local_248._0_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
            local_248._8_4_ =
                 local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27 + 2];
            fStack_23c = local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar27 + 3];
            RVar20 = _local_248;
            if (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_228,
                         (iterator)
                         local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_248);
            }
            else {
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 =
                   local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_248._4_4_;
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)local_248._8_4_;
              (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_23c;
              local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              _local_248 = RVar20;
            }
            if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1b8,
                         (iterator)
                         local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar30);
            }
            else {
              *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar30;
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar29 = uVar29 + 1;
          pfVar30 = pfVar30 + 1;
          uVar21 = (undefined4)local_148;
        } while (uVar32 != uVar29);
      }
      local_148._0_4_ = uVar21;
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = (float)((int)*local_168.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + -1);
        UNLOCK();
        if (*local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish == 0.0) {
          if (local_150 == (long *)0x0) {
            if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(*(void **)(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + -2));
            }
          }
          else {
            (**(code **)(*local_150 + 8))();
          }
        }
      }
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_138 = 0;
      local_148 = 0;
      uStack_140 = 0;
      uVar33 = uVar33 + 1;
      uVar28 = uVar28 + 1;
    } while (uVar33 != local_190);
  }
  if (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_228,&local_1b8,0,
                 (int)((ulong)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar22 = local_250->pre_nms_topN;
  if (0 < (long)iVar22) {
    if (iVar22 < (int)((ulong)((long)local_228.
                                     super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_228.
                                    super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_228,(long)iVar22);
      std::vector<float,_std::allocator<float>_>::resize(&local_1b8,(long)local_250->pre_nms_topN);
    }
  }
  local_238 = (int *)0x0;
  local_248._0_4_ = 0.0;
  local_248._4_4_ = 0.0;
  local_248._8_4_ = 0.0;
  fStack_23c = 0.0;
  local_208._0_4_ = local_250->nms_thresh;
  uVar26 = (uint)((ulong)((long)local_228.
                                super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_168,(long)(int)uVar26,(allocator_type *)&local_254);
  if ((int)uVar26 < 1) {
    local_254 = 0;
  }
  else {
    pfVar30 = &(local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    uVar32 = 0;
    do {
      uVar3 = ((Rect *)(pfVar30 + -2))->x1;
      uVar6 = ((Rect *)(pfVar30 + -2))->y1;
      local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar32] =
           ((float)((ulong)*(undefined8 *)pfVar30 >> 0x20) - (float)uVar6) *
           ((float)*(undefined8 *)pfVar30 - (float)uVar3);
      uVar32 = uVar32 + 1;
      pfVar30 = pfVar30 + 4;
    } while ((uVar26 & 0x7fffffff) != uVar32);
    local_254 = 0;
    if (0 < (int)uVar26) {
      do {
        uVar38 = (uint)((ulong)((long)stack0xfffffffffffffdc0 - local_248._0_8_) >> 2);
        if ((int)uVar38 < 1) {
LAB_001159b1:
          if (stack0xfffffffffffffdc0 == local_238) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_248,stack0xfffffffffffffdc0,
                       &local_254);
          }
          else {
            *stack0xfffffffffffffdc0 = local_254;
            stack0xfffffffffffffdc0 = stack0xfffffffffffffdc0 + 1;
          }
        }
        else {
          lVar27 = (long)local_254;
          fVar49 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27].x1;
          bVar41 = true;
          uVar32 = 0;
          do {
            iVar22 = *(int *)(local_248._0_8_ + uVar32 * 4);
            fVar50 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar22].x2;
            fVar53 = 0.0;
            if (fVar49 <= fVar50) {
              pRVar31 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + iVar22;
              fVar55 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar27].x2;
              fVar51 = pRVar31->x1;
              if (fVar51 <= fVar55) {
                fVar48 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar27].y1;
                fVar52 = pRVar31->y2;
                if (fVar48 <= fVar52) {
                  fVar2 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar27].y2;
                  fVar54 = pRVar31->y1;
                  if (fVar54 <= fVar2) {
                    if (fVar55 <= fVar50) {
                      fVar50 = fVar55;
                    }
                    if (fVar51 <= fVar49) {
                      fVar51 = fVar49;
                    }
                    if (fVar2 <= fVar52) {
                      fVar52 = fVar2;
                    }
                    if (fVar54 <= fVar48) {
                      fVar54 = fVar48;
                    }
                    fVar53 = (fVar52 - fVar54) * (fVar50 - fVar51);
                  }
                }
              }
            }
            if ((float)local_208._0_4_ <
                fVar53 / ((local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar27] - fVar53) +
                         local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar22])) {
              bVar41 = false;
            }
            uVar32 = uVar32 + 1;
          } while ((uVar38 & 0x7fffffff) != uVar32);
          if (bVar41) goto LAB_001159b1;
        }
        local_254 = local_254 + 1;
      } while (local_254 < (int)uVar26);
    }
  }
  if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar26 = (uint)((ulong)((long)stack0xfffffffffffffdc0 - local_248._0_8_) >> 2);
  if (local_250->after_nms_topN < (int)uVar26) {
    uVar26 = local_250->after_nms_topN;
  }
  pMVar15 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = pMVar15->dims;
  uVar9 = pMVar15->w;
  uVar11 = pMVar15->h;
  uVar13 = pMVar15->c;
  auVar47 = ZEXT416(uVar26);
  auVar45._0_4_ = -(uint)(uVar7 == 3);
  auVar45._4_4_ = -(uint)(uVar9 == 4);
  auVar45._8_4_ = -(uint)(uVar11 == 1);
  auVar45._12_4_ = -(uint)(uVar26 == uVar13);
  iVar22 = movmskps((int)local_130,auVar45);
  if (((iVar22 != 0xf) || (pMVar15->allocator != (Allocator *)0x0)) ||
     (uVar38 = uVar26, pMVar15->elemsize != 4)) {
    piVar16 = pMVar15->refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (pMVar15->allocator == (Allocator *)0x0) {
          if (pMVar15->data != (void *)0x0) {
            local_208 = auVar47;
            free(*(void **)((long)pMVar15->data + -8));
            auVar47 = local_208;
          }
        }
        else {
          local_208 = auVar47;
          (**(code **)(*(long *)pMVar15->allocator + 8))();
          auVar47 = local_208;
        }
      }
    }
    pMVar15->data = (void *)0x0;
    pMVar15->refcount = (int *)0x0;
    pMVar15->elemsize = 0;
    pMVar15->cstep = 0;
    pMVar15->dims = 0;
    pMVar15->w = 0;
    pMVar15->h = 0;
    pMVar15->c = 0;
    pMVar15->elemsize = 4;
    pMVar15->allocator = (Allocator *)0x0;
    pMVar15->dims = 3;
    pMVar15->w = 4;
    pMVar15->h = 1;
    pMVar15->c = uVar26;
    pMVar15->cstep = 4;
    uVar38 = auVar47._0_4_;
    if (uVar26 != 0) {
      lVar27 = (long)(int)uVar26 * 0x10;
      local_208 = auVar47;
      pvVar24 = malloc(lVar27 + 0x1c);
      pvVar35 = (void *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar35 - 8) = pvVar24;
      pMVar15->data = pvVar35;
      pMVar15->refcount = (int *)((long)pvVar35 + lVar27);
      *(undefined4 *)((long)pvVar35 + lVar27) = 1;
      uVar38 = local_208._0_4_;
    }
  }
  iVar22 = -100;
  if ((pMVar15->data != (void *)0x0) && ((long)pMVar15->c * pMVar15->cstep != 0)) {
    if (0 < (int)uVar26) {
      sVar17 = pMVar15->cstep;
      sVar18 = pMVar15->elemsize;
      pfVar30 = (float *)((long)pMVar15->data + 0xc);
      uVar32 = 0;
      do {
        iVar23 = *(int *)(local_248._0_8_ + uVar32 * 4);
        pfVar30[-3] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].x1;
        pfVar30[-2] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].y1;
        pfVar30[-1] = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar23].x2;
        *pfVar30 = local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar23].y2;
        uVar32 = uVar32 + 1;
        pfVar30 = (float *)((long)pfVar30 + sVar17 * sVar18);
      } while (uVar26 != uVar32);
    }
    pMVar15 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar27 = (long)(local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar15 >> 3;
    if (1 < (ulong)(lVar27 * 0x6db6db6db6db6db7)) {
      pMVar1 = pMVar15 + 1;
      uVar8 = pMVar15[1].dims;
      uVar10 = pMVar15[1].w;
      uVar12 = pMVar15[1].h;
      uVar14 = pMVar15[1].c;
      auVar46._0_4_ = -(uint)(uVar8 == 3);
      auVar46._4_4_ = -(uint)(uVar10 == 1);
      auVar46._8_4_ = -(uint)(uVar12 == 1);
      auVar46._12_4_ = -(uint)(uVar38 == uVar14);
      iVar23 = movmskps((int)lVar27,auVar46);
      if (((iVar23 != 0xf) || (pMVar15[1].allocator != (Allocator *)0x0)) ||
         (pMVar15[1].elemsize != 4)) {
        piVar16 = pMVar15[1].refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar15[1].allocator == (Allocator *)0x0) {
              if (pMVar15[1].data != (void *)0x0) {
                free(*(void **)((long)pMVar15[1].data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pMVar15[1].allocator + 8))();
            }
          }
        }
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        pMVar15[1].elemsize = 0;
        pMVar15[1].cstep = 0;
        pMVar15[1].dims = 0;
        pMVar15[1].w = 0;
        pMVar15[1].h = 0;
        pMVar15[1].c = 0;
        pMVar15[1].elemsize = 4;
        pMVar15[1].allocator = (Allocator *)0x0;
        pMVar15[1].dims = 3;
        pMVar15[1].w = 1;
        pMVar15[1].h = 1;
        pMVar15[1].c = uVar26;
        pMVar15[1].cstep = 4;
        if (uVar26 != 0) {
          lVar27 = (long)(int)uVar26 * 0x10;
          pvVar24 = malloc(lVar27 + 0x1c);
          pvVar35 = (void *)((long)pvVar24 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar35 - 8) = pvVar24;
          pMVar15[1].data = pvVar35;
          pMVar15[1].refcount = (int *)((long)pvVar35 + lVar27);
          *(undefined4 *)((long)pvVar35 + lVar27) = 1;
        }
      }
      if (pMVar1->data == (void *)0x0) {
        bVar41 = true;
      }
      else {
        bVar41 = (long)pMVar15[1].c * pMVar15[1].cstep == 0;
      }
      if (bVar41) goto LAB_00115d30;
      if (0 < (int)uVar26) {
        pfVar30 = (float *)pMVar15[1].data;
        sVar17 = pMVar15[1].cstep;
        sVar18 = pMVar15[1].elemsize;
        uVar32 = 0;
        do {
          *pfVar30 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(int *)(local_248._0_8_ + uVar32 * 4)];
          uVar32 = uVar32 + 1;
          pfVar30 = (float *)((long)pfVar30 + sVar17 * sVar18);
        } while (uVar26 != uVar32);
      }
    }
    iVar22 = 0;
  }
LAB_00115d30:
  if ((void *)local_248._0_8_ != (void *)0x0) {
    operator_delete((void *)local_248._0_8_,(long)local_238 - local_248._0_8_);
  }
  if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((int *)local_1f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1f8._8_8_ = *(int *)local_1f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1f8._8_8_ == 0) {
      if (plStack_1e0 == (long *)0x0) {
        if (local_1f8._0_8_ != 0) {
          free(*(void **)(local_1f8._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*plStack_1e0 + 8))();
      }
    }
  }
  return iVar22;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}